

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

int Io_MvParseLineNamesMv(Io_MvMod_t *p,char *pLine,int fReset)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  Io_MvMan_t *pIVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vTokens;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *vFunc;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pFanin;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte *pOutput;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  char *__s;
  uint nInputs;
  char *pcVar17;
  Abc_Obj_t *local_60;
  
  pIVar4 = p->pMan;
  if (pIVar4->fBlifMv == 0) {
    __assert_fail("p->pMan->fBlifMv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                  ,0x777,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
  }
  pVVar5 = pIVar4->vTokens;
  vTokens = pIVar4->vTokens2;
  pcVar17 = pLine + -1;
  do {
    pcVar16 = pcVar17;
    if (pcVar16[2] == '\0') {
      pcVar17 = (char *)0x0;
      goto LAB_002d1a93;
    }
    pcVar17 = pcVar16 + 1;
  } while ((pcVar16[2] != '>') || (pcVar16[1] != '-'));
  pcVar17[0] = ' ';
  pcVar17[1] = ' ';
LAB_002d1a93:
  if ((pcVar17 != (char *)0x0) && (pIVar4 = p->pMan, pIVar4->fBlifMv == 0)) {
    uVar8 = (ulong)pIVar4->vLines->nSize;
    uVar13 = 0xffffffff;
    if (0 < (long)uVar8) {
      uVar11 = 0;
      do {
        if (pLine < pIVar4->vLines->pArray[uVar11]) {
          uVar13 = uVar11 & 0xffffffff;
          break;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    sprintf(pIVar4->sError,"Line %d: Multi-output node symbol (->) in binary BLIF file.",uVar13);
    return 0;
  }
  Io_MvSplitIntoTokens(pVVar5,pLine,'\0');
  if (fReset == 0) {
    if (0 < pVVar5->nSize) {
      pcVar16 = (char *)*pVVar5->pArray;
      iVar6 = strcmp(pcVar16,"names");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar16,"table"), iVar6 != 0)) {
        __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"table\")"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                      ,0x784,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
      }
      goto LAB_002d1b87;
    }
  }
  else if (0 < pVVar5->nSize) {
    pcVar16 = (char *)*pVVar5->pArray;
    iVar6 = strcmp(pcVar16,"r");
    if ((iVar6 != 0) && (iVar6 = strcmp(pcVar16,"reset"), iVar6 != 0)) {
      __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"r\") || !strcmp((char *)Vec_PtrEntry(vTokens,0), \"reset\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x782,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
    }
LAB_002d1b87:
    uVar15 = pVVar5->nSize;
    nInputs = uVar15 - 2;
    uVar14 = 1;
    if ((pcVar17 != (char *)0x0) && (2 < (int)uVar15)) {
      lVar12 = (ulong)nInputs + 1;
      uVar14 = 1;
      do {
        uVar7 = (uint)(pcVar17 < pVVar5->pArray[lVar12 + -1]);
        nInputs = nInputs - uVar7;
        uVar14 = uVar14 + uVar7;
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    if ((int)uVar15 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    pcVar17 = (char *)pVVar5->pArray[(ulong)uVar15 - 1];
    sVar9 = strlen(pcVar17);
    pOutput = (byte *)(pcVar17 + sVar9);
    do {
      bVar3 = *pOutput;
      uVar8 = (ulong)bVar3;
      if (uVar8 < 0x2f) {
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0x2e) {
            if (pOutput[1] != 100) goto LAB_002d1c26;
            if ((bVar3 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0))
            goto LAB_002d1c03;
          }
        }
        else {
LAB_002d1c03:
          *pOutput = 0;
        }
      }
      pOutput = pOutput + 1;
    } while( true );
  }
LAB_002d2181:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_002d1c26:
  Io_MvCollectTokens(vTokens,pcVar17 + sVar9,(char *)pOutput);
  iVar6 = vTokens->nSize;
  if (iVar6 < 1) goto LAB_002d2181;
  pcVar16 = (char *)*vTokens->pArray;
  if (*pcVar16 == '.') {
    if (pcVar16[1] != 'd') {
      __assert_fail("pFirst[1] == \'d\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x797,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
    }
    iVar6 = iVar6 + ~uVar14;
  }
  iVar2 = uVar14 + nInputs;
  if (iVar6 % iVar2 == 0) {
    if ((nInputs == 0) && (1 < iVar6 / iVar2)) {
      uVar15 = 1;
      if (1 < (int)uVar14) {
        uVar15 = uVar14;
      }
      iVar6 = -uVar14;
      do {
        uVar14 = iVar6 + pVVar5->nSize;
        if (((int)uVar14 < 0) || (pVVar5->nSize <= (int)uVar14)) goto LAB_002d2181;
        pcVar17 = (char *)pVVar5->pArray[uVar14];
        pAVar10 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar17);
        if (fReset != 0) {
          if (p->pResetLatch == (Abc_Obj_t *)0x0) {
            __assert_fail("p->pResetLatch != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x7ae,"int Io_MvParseLineNamesMv(Io_MvMod_t *, char *, int)");
          }
          pAVar10 = Io_MvParseAddResetCircuit(p,pcVar17);
        }
        piVar1 = &p->pMan->nNDnodes;
        *piVar1 = *piVar1 + 1;
        pFanin = Abc_NtkCreateNodeConst0(p->pNtk);
        Abc_ObjAddFanin(pAVar10,pFanin);
        iVar6 = iVar6 + 1;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    else {
      uVar8 = 1;
      if (1 < (int)uVar14) {
        uVar8 = (ulong)uVar14;
      }
      uVar13 = 0;
      do {
        uVar15 = (int)uVar13 + (pVVar5->nSize - uVar14);
        if (((int)uVar15 < 0) || (pVVar5->nSize <= (int)uVar15)) goto LAB_002d2181;
        pcVar17 = (char *)pVVar5->pArray[uVar15];
        if (fReset == 0) {
          pAVar10 = Abc_NtkFindOrCreateNet(p->pNtk,pcVar17);
          if (0 < (pAVar10->vFanins).nSize) {
            pVVar5 = p->pMan->vLines;
            __s = p->pMan->sError;
            uVar8 = (ulong)pVVar5->nSize;
            uVar13 = 0xffffffff;
            if ((long)uVar8 < 1) goto LAB_002d2175;
            uVar11 = 0;
            goto LAB_002d2155;
          }
          local_60 = Io_ReadCreateNode(p->pNtk,pcVar17,(char **)(pVVar5->pArray + 1),nInputs);
        }
        else {
          pAVar10 = Abc_NtkFindNet(p->pNtk,pcVar17);
          if (pAVar10 == (Abc_Obj_t *)0x0) {
            pVVar5 = p->pMan->vLines;
            __s = p->pMan->sError;
            uVar8 = (ulong)pVVar5->nSize;
            uVar13 = 0xffffffff;
            if ((long)uVar8 < 1) goto LAB_002d2167;
            uVar11 = 0;
            goto LAB_002d2122;
          }
          pAVar10 = Io_MvParseAddResetCircuit(p,pcVar17);
          pNtk = p->pNtk;
          pcVar17 = Abc_ObjName(pAVar10);
          local_60 = Io_ReadCreateNode(pNtk,pcVar17,(char **)(pVVar5->pArray + 1),nInputs);
          if (pVVar5->nSize - 2U != nInputs) {
            __assert_fail("nInputs == Vec_PtrSize(vTokens) - 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x750,
                          "int Io_MvParseLineNamesMvOne(Io_MvMod_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int, int, int)"
                         );
          }
        }
        vFunc = p->pMan->vFunc;
        vFunc->nSize = 0;
        if (vTokens->nSize < 1) goto LAB_002d2181;
        uVar15 = 0;
        if (**vTokens->pArray == '.') {
          if (vFunc->nCap == 0) {
            if (vFunc->pArray == (char *)0x0) {
              pcVar17 = (char *)malloc(0x10);
            }
            else {
              pcVar17 = (char *)realloc(vFunc->pArray,0x10);
            }
            vFunc->pArray = pcVar17;
            vFunc->nCap = 0x10;
          }
          iVar6 = vFunc->nSize;
          vFunc->nSize = iVar6 + 1;
          vFunc->pArray[iVar6] = 'd';
          if ((long)vTokens->nSize <= (long)(uVar13 + 1)) goto LAB_002d2181;
          iVar6 = Io_MvParseLiteralMv(p,local_60,(char *)vTokens->pArray[uVar13 + 1],vFunc,-1);
          uVar15 = uVar14 + 1;
          if (iVar6 != 0) goto LAB_002d1f42;
          pcVar17 = (char *)0x0;
        }
        else {
LAB_002d1f42:
          if ((int)uVar15 < vTokens->nSize) {
            do {
              if (0 < (int)nInputs) {
                if ((int)uVar15 < 0) goto LAB_002d2181;
                uVar11 = 0;
                do {
                  if (vTokens->nSize <= (int)(uVar15 + (int)uVar11)) goto LAB_002d2181;
                  iVar6 = Io_MvParseLiteralMv(p,local_60,(char *)vTokens->pArray[uVar15 + uVar11],
                                              vFunc,(int)uVar11);
                  if (iVar6 == 0) goto LAB_002d2047;
                  uVar11 = uVar11 + 1;
                } while (nInputs != uVar11);
              }
              uVar7 = (int)uVar13 + nInputs + uVar15;
              if (((int)uVar7 < 0) || (vTokens->nSize <= (int)uVar7)) goto LAB_002d2181;
              iVar6 = Io_MvParseLiteralMv(p,local_60,(char *)vTokens->pArray[uVar7],vFunc,-1);
              if (iVar6 == 0) {
LAB_002d2047:
                pcVar17 = (char *)0x0;
                goto LAB_002d20b5;
              }
              uVar15 = uVar15 + iVar2;
            } while ((int)uVar15 < vTokens->nSize);
          }
          uVar15 = vFunc->nCap;
          if (vFunc->nSize == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (vFunc->pArray == (char *)0x0) {
                pcVar17 = (char *)malloc(0x10);
              }
              else {
                pcVar17 = (char *)realloc(vFunc->pArray,0x10);
              }
              vFunc->pArray = pcVar17;
              sVar9 = 0x10;
            }
            else {
              sVar9 = (ulong)uVar15 * 2;
              if ((int)sVar9 <= (int)uVar15) goto LAB_002d209a;
              if (vFunc->pArray == (char *)0x0) {
                pcVar17 = (char *)malloc(sVar9);
              }
              else {
                pcVar17 = (char *)realloc(vFunc->pArray,sVar9);
              }
              vFunc->pArray = pcVar17;
            }
            vFunc->nCap = (int)sVar9;
          }
LAB_002d209a:
          iVar6 = vFunc->nSize;
          vFunc->nSize = iVar6 + 1;
          vFunc->pArray[iVar6] = '\0';
          pcVar17 = vFunc->pArray;
        }
LAB_002d20b5:
        (local_60->field_5).pData = pcVar17;
        if (pcVar17 == (char *)0x0) {
          return 0;
        }
        pcVar17 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,pcVar17);
        (local_60->field_5).pData = pcVar17;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar8);
    }
    return 1;
  }
  pVVar5 = p->pMan->vLines;
  __s = p->pMan->sError;
  uVar8 = (ulong)pVVar5->nSize;
  uVar13 = 0xffffffff;
  if (0 < (long)uVar8) {
    uVar11 = 0;
    do {
      if (pcVar16 < pVVar5->pArray[uVar11]) {
        uVar13 = uVar11 & 0xffffffff;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  pcVar16 = 
  "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)"
  ;
  goto LAB_002d1d72;
  while (uVar11 = uVar11 + 1, uVar8 != uVar11) {
LAB_002d2155:
    if (pcVar17 < pVVar5->pArray[uVar11]) {
      uVar13 = uVar11 & 0xffffffff;
      break;
    }
  }
LAB_002d2175:
  pcVar16 = "Line %d: Signal \"%s\" is defined more than once.";
  goto LAB_002d1d72;
  while (uVar11 = uVar11 + 1, uVar8 != uVar11) {
LAB_002d2122:
    if (pcVar17 < pVVar5->pArray[uVar11]) {
      uVar13 = uVar11 & 0xffffffff;
      break;
    }
  }
LAB_002d2167:
  pcVar16 = "Line %d: Latch with output signal \"%s\" does not exist.";
LAB_002d1d72:
  sprintf(__s,pcVar16,uVar13,pcVar17);
  return 0;
}

Assistant:

static int Io_MvParseLineNamesMv( Io_MvMod_t * p, char * pLine, int fReset )
{
    Vec_Ptr_t * vTokens = p->pMan->vTokens;
    Vec_Ptr_t * vTokens2 = p->pMan->vTokens2;
    Abc_Obj_t * pNet;
    char * pName, * pFirst, * pArrow;
    int nInputs, nOutputs, nLiterals, nLines, i;
    assert( p->pMan->fBlifMv );
    // get the arrow if it is present
    pArrow = Io_MvFindArrow( pLine );
    if ( !p->pMan->fBlifMv && pArrow ) 
    {
        sprintf( p->pMan->sError, "Line %d: Multi-output node symbol (->) in binary BLIF file.", Io_MvGetLine(p->pMan, pLine) );
        return 0;
    }
    // split names line into tokens
    Io_MvSplitIntoTokens( vTokens, pLine, '\0' );
    if ( fReset )
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "r") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "reset") );
    else
        assert( !strcmp((char *)Vec_PtrEntry(vTokens,0), "names") || !strcmp((char *)Vec_PtrEntry(vTokens,0), "table") );
    // find the number of inputs and outputs
    nInputs  = Vec_PtrSize(vTokens) - 2;
    nOutputs = 1;
    if ( pArrow != NULL )
    {
        for ( i = Vec_PtrSize(vTokens) - 2; i >= 1; i-- )
            if ( pArrow < (char*)Vec_PtrEntry(vTokens,i) )
            {
                nInputs--;
                nOutputs++;
            }
    }
    // split table into tokens
    pName = (char *)Vec_PtrEntryLast( vTokens );
    Io_MvSplitIntoTokensMv( vTokens2, pName + strlen(pName) );
    pFirst = (char *)Vec_PtrEntry( vTokens2, 0 );
    if ( pFirst[0] == '.' )
    {
        assert( pFirst[1] == 'd' );
        nLiterals = Vec_PtrSize(vTokens2) - 1 - nOutputs;
    }
    else
        nLiterals = Vec_PtrSize(vTokens2);
    // check the number of lines
    if ( nLiterals % (nInputs + nOutputs) != 0 )
    {
        sprintf( p->pMan->sError, "Line %d: Wrong number of literals in the table of node \"%s\". (Spaces inside literals are not allowed.)", Io_MvGetLine(p->pMan, pFirst), pName );
        return 0;
    }
    // check for the ND table
    nLines = nLiterals / (nInputs + nOutputs);
    if ( nInputs == 0 && nLines > 1 )
    {
        // add the outputs to the PIs
        for ( i = 0; i < nOutputs; i++ )
        {
            pName = (char *)Vec_PtrEntry( vTokens, Vec_PtrSize(vTokens) - nOutputs + i );
            // get the net corresponding to this node
            pNet = Abc_NtkFindOrCreateNet(p->pNtk, pName);
            if ( fReset )
            {
                assert( p->pResetLatch != NULL );
                // construct the reset circuit and get the reset net feeding into it
                pNet = Io_MvParseAddResetCircuit( p, pName );
            }
            // add the new PI node
//            Abc_ObjAddFanin( pNet, Abc_NtkCreatePi(p->pNtk) );
//            fprintf( stdout, "Io_ReadBlifMv(): Adding PI for internal non-deterministic node \"%s\".\n", pName );
            p->pMan->nNDnodes++;
            Abc_ObjAddFanin( pNet, Abc_NtkCreateNodeConst0(p->pNtk) );
        }
        return 1;
    }
    // iterate through the outputs
    for ( i = 0; i < nOutputs; i++ )
    {
        if ( !Io_MvParseLineNamesMvOne( p, vTokens, vTokens2, nInputs, nOutputs, i, fReset ) )
            return 0;
    }
    return 1;
}